

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManFilterEquivsUsingParts(Gia_Man_t *pGia,char *pName1,char *pName2)

{
  uint uVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int Num;
  int Id;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *p_00;
  ulong uVar9;
  uint *puVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  int i;
  long lVar14;
  ulong uVar15;
  uint local_54;
  
  if ((pGia->pReprs == (Gia_Rpr_t *)0x0) || (pGia->pNexts == (int *)0x0)) {
    pcVar13 = "Equivalences are not defined.\n";
LAB_001e9735:
    Abc_Print(1,pcVar13);
  }
  else {
    p0 = Gia_AigerRead(pName1,0,0,0);
    if (p0 == (Gia_Man_t *)0x0) {
      pcVar13 = "Cannot read first file %s.\n";
      pName2 = pName1;
    }
    else {
      p1 = Gia_AigerRead(pName2,0,0,0);
      if (p1 != (Gia_Man_t *)0x0) {
        p = Gia_ManMiter(p0,p1,0,0,1,0,0);
        if (p == (Gia_Man_t *)0x0) {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          pcVar13 = "Cannot create sequential miter.\n";
        }
        else if (pGia->nObjs == p->nObjs) {
          iVar5 = bcmp(pGia->pObjs,p->pObjs,(long)pGia->nObjs * 0xc);
          if (iVar5 == 0) {
            Gia_ManCleanMark0(pGia);
            pGVar8 = (Gia_Obj_t *)0x0;
            iVar5 = 0;
            while ((iVar5 < p0->nObjs && (pGVar7 = Gia_ManObj(p0,iVar5), pGVar7 != (Gia_Obj_t *)0x0)
                   )) {
              if (pGVar7->Value != 0xffffffff) {
                iVar6 = Abc_Lit2Var(pGVar7->Value);
                pGVar8 = Gia_ManObj(p,iVar6);
                iVar6 = Gia_ObjId(p,pGVar8);
                pGVar8 = Gia_ManObj(pGia,iVar6);
                pGVar8->field_0x3 = pGVar8->field_0x3 | 0x40;
              }
              iVar5 = iVar5 + 1;
            }
            Gia_ManCleanMark1(pGia);
            iVar5 = 0;
            while ((iVar5 < p1->nObjs && (pGVar7 = Gia_ManObj(p1,iVar5), pGVar7 != (Gia_Obj_t *)0x0)
                   )) {
              if (pGVar7->Value != 0xffffffff) {
                iVar6 = Abc_Lit2Var(pGVar7->Value);
                pGVar8 = Gia_ManObj(p,iVar6);
                iVar6 = Gia_ObjId(p,pGVar8);
                pGVar8 = Gia_ManObj(pGia,iVar6);
                *(ulong *)pGVar8 = *(ulong *)pGVar8 | 0x4000000000000000;
              }
              iVar5 = iVar5 + 1;
            }
            uVar12 = 0;
            local_54 = 0;
            for (lVar14 = 1; lVar14 < pGia->nObjs; lVar14 = lVar14 + 1) {
              if (((uint)pGia->pReprs[lVar14] & 0xfffffff) == 0) {
                pGVar8 = Gia_ManObj(pGia,(int)lVar14);
                if (pGia->pNexts[lVar14] != 0) {
                  __assert_fail("pGia->pNexts[i] == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                ,0x973,
                                "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                }
                uVar12 = uVar12 + 1;
                if ((*(ulong *)pGVar8 & 0x4000000040000000) == 0x4000000040000000) {
                  pGia->pReprs[lVar14] = (Gia_Rpr_t)((uint)pGia->pReprs[lVar14] | 0xfffffff);
                }
                else {
                  if ((*(ulong *)pGVar8 & 0x4000000040000000) == 0) {
                    __assert_fail("pObj->fMark0 || pObj->fMark1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                  ,0x974,
                                  "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                  }
                  local_54 = local_54 + 1;
                }
              }
            }
            p_00 = Vec_IntAlloc(100);
            uVar15 = 1;
            do {
              if ((long)pGia->nObjs <= (long)uVar15) {
                Vec_IntFree(p_00);
                Abc_Print(1,"The number of literals: Before = %d. After = %d.\n",(ulong)uVar12,
                          (ulong)local_54);
                Gia_ManCleanMark0(pGia);
                Gia_ManCleanMark1(pGia);
                return 1;
              }
              iVar5 = Gia_ObjIsHead(pGia,(int)uVar15);
              if (iVar5 != 0) {
                if (((undefined1  [12])*pGVar8 & (undefined1  [12])0x4000000040000000) ==
                    (undefined1  [12])0x0) {
                  __assert_fail("pObj->fMark0 || pObj->fMark1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                ,0x97f,
                                "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                }
                p_00->nSize = 0;
                uVar12 = uVar12 - 1;
                bVar3 = false;
                bVar4 = false;
                for (uVar11 = uVar15 & 0xffffffff; iVar5 = (int)uVar11, 0 < iVar5;
                    uVar11 = (ulong)(uint)pGia->pNexts[uVar11]) {
                  pGVar8 = Gia_ManObj(pGia,iVar5);
                  uVar9 = *(ulong *)pGVar8;
                  if ((uVar9 & 0x4000000040000000) == 0x40000000) {
                    Vec_IntPush(p_00,iVar5);
                    uVar9 = *(ulong *)pGVar8;
                    bVar3 = true;
                  }
                  if ((uVar9 & 0x4000000040000000) == 0x4000000000000000) {
                    Vec_IntPush(p_00,iVar5);
                    bVar4 = true;
                  }
                  uVar12 = uVar12 + 1;
                }
                puVar10 = (uint *)(pGia->pNexts + uVar15);
                uVar11 = uVar15;
                while (iVar5 = (int)uVar11, iVar5 != 0) {
                  uVar1 = *puVar10;
                  pGia->pReprs[iVar5] = (Gia_Rpr_t)((uint)pGia->pReprs[iVar5] | 0xfffffff);
                  piVar2 = pGia->pNexts;
                  piVar2[iVar5] = 0;
                  puVar10 = (uint *)(piVar2 + (int)uVar1);
                  uVar11 = (ulong)uVar1;
                }
                iVar5 = Gia_ObjIsHead(pGia,(int)uVar15);
                if (iVar5 != 0) {
                  __assert_fail("!Gia_ObjIsHead(pGia, i)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                ,0x998,
                                "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                }
                if ((bVar4 && bVar3) && (iVar5 = p_00->nSize, 1 < iVar5)) {
                  Num = Vec_IntEntry(p_00,0);
                  iVar6 = Num;
                  for (i = 1; iVar5 != i; i = i + 1) {
                    Id = Vec_IntEntry(p_00,i);
                    Gia_ObjSetRepr(pGia,Id,Num);
                    pGia->pNexts[iVar6] = Id;
                    iVar6 = Id;
                  }
                  if (pGia->pNexts[iVar6] != 0) {
                    __assert_fail("Gia_ObjNext(pGia, iPrev) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                  ,0x9a4,
                                  "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                  }
                  local_54 = (local_54 - 1) + iVar5;
                }
              }
              uVar15 = uVar15 + 1;
            } while( true );
          }
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Gia_ManStop(p);
          pcVar13 = "The AIG structure of the miter does not match.\n";
        }
        else {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Gia_ManStop(p);
          pcVar13 = "The number of objects in different.\n";
        }
        goto LAB_001e9735;
      }
      Gia_ManStop((Gia_Man_t *)0x0);
      pcVar13 = "Cannot read second file %s.\n";
    }
    Abc_Print(1,pcVar13,pName2);
  }
  return 0;
}

Assistant:

int Gia_ManFilterEquivsUsingParts( Gia_Man_t * pGia, char * pName1, char * pName2 )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pGia1, * pGia2, * pMiter;
    Gia_Obj_t * pObj1, * pObj2, * pObjM, * pObj = NULL;
    int i, k, iObj, iNext, iPrev, iRepr;
    int iLitsOld, iLitsNew;
    if ( pGia->pReprs == NULL || pGia->pNexts == NULL )
    {
        Abc_Print( 1, "Equivalences are not defined.\n" );
        return 0;
    }
    pGia1 = Gia_AigerRead( pName1, 0, 0, 0 );
    if ( pGia1 == NULL )
    {
        Abc_Print( 1, "Cannot read first file %s.\n", pName1 );
        return 0;
    }
    pGia2 = Gia_AigerRead( pName2, 0, 0, 0 );
    if ( pGia2 == NULL )
    {
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot read second file %s.\n", pName2 );
        return 0;
    }
    pMiter = Gia_ManMiter( pGia1, pGia2, 0, 0, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot create sequential miter.\n" );
        return 0;
    }
    // make sure the miter is isomorphic
    if ( Gia_ManObjNum(pGia) != Gia_ManObjNum(pMiter) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The number of objects in different.\n" );
        return 0;
    }
    if ( memcmp( pGia->pObjs, pMiter->pObjs, sizeof(Gia_Obj_t) *  Gia_ManObjNum(pGia) ) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The AIG structure of the miter does not match.\n" );
        return 0;
    }
    // transfer copies
    Gia_ManCleanMark0( pGia );
    Gia_ManForEachObj( pGia1, pObj1, i )
    {
        if ( pObj1->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj1->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark0 = 1;
    }
    Gia_ManCleanMark1( pGia );
    Gia_ManForEachObj( pGia2, pObj2, i )
    {
        if ( pObj2->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj2->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark1 = 1;
    }

    // filter equivalences
    iLitsOld = iLitsNew = 0;
    Gia_ManForEachConst( pGia, i )
    {
        iLitsOld++;
        pObj = Gia_ManObj( pGia, i );
        assert( pGia->pNexts[i] == 0 );
        assert( pObj->fMark0 || pObj->fMark1 );
        if ( pObj->fMark0 && pObj->fMark1 ) // belongs to both A and B
            Gia_ObjUnsetRepr( pGia, i );
        else
            iLitsNew++;
    }
    // filter equivalences
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( pGia, i )
    {
        int fSeenA = 0, fSeenB = 0;
        assert( pObj->fMark0 || pObj->fMark1 );
        Vec_IntClear( vNodes );
        Gia_ClassForEachObj( pGia, i, iObj )
        {
            pObj = Gia_ManObj( pGia, iObj );
            if ( pObj->fMark0 && !pObj->fMark1 )
            {
                fSeenA = 1;
                Vec_IntPush( vNodes, iObj );
            }
            if ( !pObj->fMark0 && pObj->fMark1 )
            {
                fSeenB = 1;
                Vec_IntPush( vNodes, iObj );
            }
            iLitsOld++;
        }
        iLitsOld--;
        // undo equivalence classes
        for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
              iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
        {
            Gia_ObjUnsetRepr( pGia, iObj );
            Gia_ObjSetNext( pGia, iObj, 0 );
        }
        assert( !Gia_ObjIsHead(pGia, i) );
        if ( fSeenA && fSeenB && Vec_IntSize(vNodes) > 1 )
        {
            // create new class
            iPrev = iRepr = Vec_IntEntry( vNodes, 0 );
            Vec_IntForEachEntryStart( vNodes, iObj, k, 1 )
            {
                Gia_ObjSetRepr( pGia, iObj, iRepr );
                Gia_ObjSetNext( pGia, iPrev, iObj );
                iPrev = iObj;
                iLitsNew++;
            }
            assert( Gia_ObjNext(pGia, iPrev) == 0 );
        }
    }
    Vec_IntFree( vNodes );
    Abc_Print( 1, "The number of literals: Before = %d. After = %d.\n", iLitsOld, iLitsNew );
//Gia_ManEquivPrintClasses( pGia, 1, 0 );

    Gia_ManCleanMark0( pGia );
    Gia_ManCleanMark1( pGia );
    return 1;
}